

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O1

void __thiscall Voice::Voice(Voice *this)

{
  undefined8 *puVar1;
  ChannelData *__s;
  long lVar2;
  long lVar3;
  ChannelData *__cur;
  
  (this->mUpdate)._M_b._M_p = (__pointer_type)0x0;
  this->mStep = 0;
  this->mFlags = 0;
  this->mNumCallbackSamples = 0;
  (this->mDirect).Buffer.mData = (pointer)0x0;
  (this->mDirect).Buffer.mDataEnd = (pointer)0x0;
  this->mSourceID = (__atomic_base<unsigned_int>)0x0;
  this->mPlayState = Stopped;
  (this->mPendingChange)._M_base._M_i = false;
  lVar3 = -0x90;
  do {
    puVar1 = (undefined8 *)
             ((long)&(this->mChans).
                     super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0);
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 2;
  __s = al::allocator<Voice::ChannelData,_16UL>::allocate
                  ((allocator<Voice::ChannelData,_16UL> *)&this->mChans,2);
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s;
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 2;
  do {
    memset(__s,0,4000);
    (__s->mDryParams).LowPass.mB0 = 1.0;
    (__s->mDryParams).LowPass.mB1 = 0.0;
    (__s->mDryParams).LowPass.mB2 = 0.0;
    (__s->mDryParams).LowPass.mA1 = 0.0;
    (__s->mDryParams).LowPass.mA2 = 0.0;
    (__s->mDryParams).HighPass.mZ1 = 0.0;
    (__s->mDryParams).HighPass.mZ2 = 0.0;
    (__s->mDryParams).HighPass.mB0 = 1.0;
    (__s->mDryParams).HighPass.mB1 = 0.0;
    (__s->mDryParams).HighPass.mB2 = 0.0;
    (__s->mDryParams).HighPass.mA1 = 0.0;
    (__s->mDryParams).HighPass.mA2 = 0.0;
    lVar2 = 0xb78;
    do {
      *(undefined8 *)((long)(__s->mPrevSamples)._M_elems + lVar2 + -0x28) = 0;
      *(undefined4 *)((long)(__s->mPrevSamples)._M_elems + lVar2 + -0x20) = 0x3f800000;
      puVar1 = (undefined8 *)((long)(__s->mPrevSamples)._M_elems + lVar2 + -0x1c);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(__s->mPrevSamples)._M_elems + lVar2 + -0xc) = 0;
      *(undefined4 *)((long)(__s->mPrevSamples)._M_elems + lVar2 + -4) = 0x3f800000;
      puVar1 = (undefined8 *)((long)(__s->mPrevSamples)._M_elems + lVar2);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar2 = lVar2 + 0xb8;
    } while (lVar2 != 0xfc8);
    __s = __s + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  (this->mChans).super__Vector_base<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s;
  return;
}

Assistant:

Voice() = default;